

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depspawn.cpp
# Opt level: O2

bool __thiscall depspawn::internal::arg_info::overlap_array(arg_info *this,arg_info *other)

{
  char cVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  cVar1 = this->rank;
  uVar5 = 0;
  if ('\0' < cVar1) {
    uVar5 = (ulong)(uint)(int)cVar1;
  }
  do {
    if ((this->wr != false) || (other->wr == true)) {
      for (uVar6 = 0; uVar7 = uVar5, uVar5 != uVar6; uVar6 = uVar6 + 1) {
        iVar2 = this->array_range[uVar6].first;
        iVar3 = other->array_range[uVar6].first;
        bVar4 = iVar3 <= this->array_range[uVar6].second;
        if (iVar3 < iVar2) {
          bVar4 = iVar2 <= other->array_range[uVar6].second;
        }
        uVar7 = uVar6;
        if (!bVar4) break;
      }
      if ((uint)uVar7 == (int)cVar1) {
        return true;
      }
    }
    other = other->next;
    if ((other == (arg_info *)0x0) || (this->addr != other->addr)) {
      return false;
    }
  } while( true );
}

Assistant:

bool arg_info::overlap_array(const arg_info *other) const
    { int i;

      const int lim = rank;
      
      do {
	
	if(wr || other->wr) {
	  //if(data != other->data) return false; SHOULD be ==
	  
	  assert(lim == other->rank);
	  
	  for(i = 0; i < lim; i++) {
	    if(!overlaps_intervals(std::get<0>(array_range[i]), std::get<1>(array_range[i]),
				   std::get<0>(other->array_range[i]), std::get<1>(other->array_range[i])))
	      break;
	  }
	  
	  if(i == lim) {
	    //if(depspawn::debug) std::cout << "DEP FOUND\n";
	    return true;
	  }
	}
	
	other = other->next;
	
      } while(other && (addr == other->addr));
      
      return false;
    }